

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

void Assimp::SceneCombiner::Copy(aiMetadata **_dest,aiMetadata *src)

{
  uint uVar1;
  aiMetadataEntry *paVar2;
  uint *puVar3;
  undefined8 *puVar4;
  aiMetadata *paVar5;
  aiString *paVar6;
  aiMetadataEntry *paVar7;
  uint *puVar8;
  aiString *paVar9;
  long lVar10;
  ulong uVar11;
  
  if (src != (aiMetadata *)0x0 && _dest != (aiMetadata **)0x0) {
    uVar1 = src->mNumProperties;
    uVar11 = (ulong)uVar1;
    if (uVar11 != 0) {
      paVar5 = (aiMetadata *)operator_new(0x18);
      paVar5->mNumProperties = uVar1;
      paVar6 = (aiString *)operator_new__(uVar11 * 0x404);
      paVar9 = paVar6;
      do {
        paVar9->length = 0;
        paVar9->data[0] = '\0';
        memset(paVar9->data + 1,0x1b,0x3ff);
        paVar9 = paVar9 + 1;
      } while (paVar9 != paVar6 + uVar11);
      paVar5->mKeys = paVar6;
      paVar7 = (aiMetadataEntry *)operator_new__(uVar11 << 4);
      memset(paVar7,0,uVar11 << 4);
      paVar5->mValues = paVar7;
      *_dest = paVar5;
      uVar11 = (ulong)src->mNumProperties;
      if (uVar11 == 0) {
        paVar7 = (aiMetadataEntry *)operator_new__(0);
        paVar5->mValues = paVar7;
      }
      else {
        paVar9 = src->mKeys;
        lVar10 = uVar11 + 1;
        do {
          if (paVar9 != paVar6) {
            uVar1 = paVar9->length;
            paVar6->length = uVar1;
            memcpy(paVar6->data,paVar9->data,(ulong)uVar1);
            paVar6->data[uVar1] = '\0';
          }
          paVar9 = paVar9 + 1;
          paVar6 = paVar6 + 1;
          lVar10 = lVar10 + -1;
        } while (1 < lVar10);
        paVar7 = (aiMetadataEntry *)operator_new__(uVar11 << 4);
        paVar5->mValues = paVar7;
        if (uVar11 != 0) {
          lVar10 = 0;
          uVar11 = 0;
          do {
            paVar7 = src->mValues;
            paVar2 = paVar5->mValues;
            *(undefined4 *)((long)&paVar2->mType + lVar10) =
                 *(undefined4 *)((long)&paVar7->mType + lVar10);
            switch(*(undefined4 *)((long)&paVar5->mValues->mType + lVar10)) {
            case 0:
              puVar8 = (uint *)operator_new(1);
              *(undefined1 *)puVar8 = **(undefined1 **)((long)&paVar7->mData + lVar10);
              break;
            case 1:
              puVar8 = (uint *)operator_new(4);
              *puVar8 = **(uint **)((long)&paVar7->mData + lVar10);
              break;
            case 2:
              puVar8 = (uint *)operator_new(8);
              *(undefined8 *)puVar8 = **(undefined8 **)((long)&paVar7->mData + lVar10);
              break;
            case 3:
              puVar8 = (uint *)operator_new(4);
              *puVar8 = **(uint **)((long)&paVar7->mData + lVar10);
              break;
            case 4:
              puVar8 = (uint *)operator_new(8);
              *(undefined8 *)puVar8 = **(undefined8 **)((long)&paVar7->mData + lVar10);
              break;
            case 5:
              puVar8 = (uint *)operator_new(0x404);
              puVar3 = *(uint **)((long)&paVar7->mData + lVar10);
              uVar1 = *puVar3;
              if (0x3fe < uVar1) {
                uVar1 = 0x3ff;
              }
              *puVar8 = uVar1;
              memcpy(puVar8 + 1,puVar3 + 1,(ulong)uVar1);
              *(undefined1 *)((long)puVar8 + (ulong)uVar1 + 4) = 0;
              break;
            case 6:
              puVar8 = (uint *)operator_new(0xc);
              puVar4 = *(undefined8 **)((long)&paVar7->mData + lVar10);
              *(undefined8 *)puVar8 = *puVar4;
              puVar8[2] = *(uint *)(puVar4 + 1);
              break;
            default:
              goto switchD_00199079_default;
            }
            *(uint **)((long)&paVar2->mData + lVar10) = puVar8;
switchD_00199079_default:
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar11 < src->mNumProperties);
        }
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMetadata** _dest, const aiMetadata* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if ( 0 == src->mNumProperties ) {
        return;
    }

    aiMetadata* dest = *_dest = aiMetadata::Alloc( src->mNumProperties );
    std::copy(src->mKeys, src->mKeys + src->mNumProperties, dest->mKeys);

    dest->mValues = new aiMetadataEntry[src->mNumProperties];
    for (unsigned int i = 0; i < src->mNumProperties; ++i) {
        aiMetadataEntry& in = src->mValues[i];
        aiMetadataEntry& out = dest->mValues[i];
        out.mType = in.mType;
        switch (dest->mValues[i].mType) {
            case AI_BOOL:
                out.mData = new bool(*static_cast<bool*>(in.mData));
                break;
            case AI_INT32:
                out.mData = new int32_t(*static_cast<int32_t*>(in.mData));
                break;
            case AI_UINT64:
                out.mData = new uint64_t(*static_cast<uint64_t*>(in.mData));
                break;
            case AI_FLOAT:
                out.mData = new float(*static_cast<float*>(in.mData));
                break;
            case AI_DOUBLE:
                out.mData = new double(*static_cast<double*>(in.mData));
                break;
            case AI_AISTRING:
                out.mData = new aiString(*static_cast<aiString*>(in.mData));
                break;
            case AI_AIVECTOR3D:
                out.mData = new aiVector3D(*static_cast<aiVector3D*>(in.mData));
                break;
            default:
                ai_assert(false);
                break;
        }
    }
}